

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# outputtype.cpp
# Opt level: O2

optional<OutputType> ParseOutputType(string *type)

{
  long lVar1;
  __type_conflict1 _Var2;
  ulong uVar3;
  long in_FS_OFFSET;
  ulong uStack_20;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar3 = 0x100000000;
  _Var2 = std::operator==(type,&OUTPUT_TYPE_STRING_LEGACY_abi_cxx11_);
  if (_Var2) {
    uStack_20 = 0;
  }
  else {
    _Var2 = std::operator==(type,&OUTPUT_TYPE_STRING_P2SH_SEGWIT_abi_cxx11_);
    if (_Var2) {
      uStack_20 = 1;
    }
    else {
      _Var2 = std::operator==(type,&OUTPUT_TYPE_STRING_BECH32_abi_cxx11_);
      if (_Var2) {
        uStack_20 = 2;
      }
      else {
        _Var2 = std::operator==(type,&OUTPUT_TYPE_STRING_BECH32M_abi_cxx11_);
        if (!_Var2) {
          uVar3 = 0;
        }
        uStack_20 = 3;
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (_Optional_base<OutputType,_true,_true>)
         (_Optional_base<OutputType,_true,_true>)(uVar3 | uStack_20);
}

Assistant:

std::optional<OutputType> ParseOutputType(const std::string& type)
{
    if (type == OUTPUT_TYPE_STRING_LEGACY) {
        return OutputType::LEGACY;
    } else if (type == OUTPUT_TYPE_STRING_P2SH_SEGWIT) {
        return OutputType::P2SH_SEGWIT;
    } else if (type == OUTPUT_TYPE_STRING_BECH32) {
        return OutputType::BECH32;
    } else if (type == OUTPUT_TYPE_STRING_BECH32M) {
        return OutputType::BECH32M;
    }
    return std::nullopt;
}